

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

int Gia_ManCombMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  
  iVar6 = 0;
  if (pObj != (Gia_Obj_t *)0x0) {
    uVar1 = *(ulong *)pObj;
    uVar7 = (uint)uVar1;
    if ((uVar7 >> 0x1e & 1) == 0) {
      return 0;
    }
    *(ulong *)pObj = uVar1 & 0xffffffffbfffffff;
    if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                    ,0x34,"int Gia_ManCombMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (((uVar7 & 0x1fffffff) != 0x1fffffff) &&
       ((uVar7 & 0x1fffffff) == ((uint)(uVar1 >> 0x20) & 0x1fffffff))) {
      __assert_fail("!Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                    ,0x35,"int Gia_ManCombMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ManCombMarkUsed_rec(p,pObj + -(ulong)(uVar7 & 0x1fffffff));
    iVar3 = Gia_ManCombMarkUsed_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar5 = 0;
    iVar4 = 0;
    if (p->pNexts != (int *)0x0) {
      pGVar8 = p->pObjs;
      if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_0022320d;
      uVar7 = p->pNexts[(int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555];
      if ((ulong)uVar7 == 0) {
        pGVar8 = (Gia_Obj_t *)0x0;
      }
      else {
        if (((int)uVar7 < 0) || (p->nObjs <= (int)uVar7)) goto LAB_0022322c;
        pGVar8 = pGVar8 + uVar7;
      }
      iVar4 = Gia_ManCombMarkUsed_rec(p,pGVar8);
    }
    if (p->pSibls != (int *)0x0) {
      pGVar8 = p->pObjs;
      if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) goto LAB_0022320d;
      uVar7 = p->pSibls[(int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555];
      if ((ulong)uVar7 == 0) {
        pGVar8 = (Gia_Obj_t *)0x0;
      }
      else {
        if (((int)uVar7 < 0) || (p->nObjs <= (int)uVar7)) goto LAB_0022322c;
        pGVar8 = pGVar8 + uVar7;
      }
      iVar5 = Gia_ManCombMarkUsed_rec(p,pGVar8);
    }
    if (p->pMuxes == (uint *)0x0) {
      iVar6 = 0;
    }
    else {
      pGVar8 = p->pObjs;
      if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) {
LAB_0022320d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar7 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555];
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = uVar7 >> 1;
      if (p->nObjs <= (int)uVar7) {
LAB_0022322c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar6 = Gia_ManCombMarkUsed_rec(p,pGVar8 + uVar7);
    }
    iVar6 = iVar2 + iVar3 + 1 + iVar4 + iVar5 + iVar6;
  }
  return iVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks unreachable internal nodes and returns their number.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManCombMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
        return 0;
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    return 1 + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) )
             + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin1(pObj) )
             + (p->pNexts ? Gia_ManCombMarkUsed_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pSibls ? Gia_ManCombMarkUsed_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pMuxes ? Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin2(p, pObj) ) : 0);
}